

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUTF8Transcoder.cpp
# Opt level: O0

XMLSize_t __thiscall
xercesc_4_0::XMLUTF8Transcoder::transcodeTo
          (XMLUTF8Transcoder *this,XMLCh *srcData,XMLSize_t srcCount,XMLByte *toFill,
          XMLSize_t maxBytes,XMLSize_t *charsEaten,UnRepOpts options)

{
  MemoryManager *pMVar1;
  TranscodingException *this_00;
  XMLCh *text2;
  XMLByte *pXVar2;
  XMLCh local_98 [4];
  XMLCh tmpBuf [17];
  uint local_6c;
  uint local_68;
  uint encodedBytes;
  uint srcUsed;
  XMLUInt32 curVal;
  XMLByte *outEnd;
  XMLByte *outPtr;
  XMLCh *srcEnd;
  XMLCh *srcPtr;
  XMLSize_t *charsEaten_local;
  XMLSize_t maxBytes_local;
  XMLByte *toFill_local;
  XMLSize_t srcCount_local;
  XMLCh *srcData_local;
  XMLUTF8Transcoder *this_local;
  
  if ((srcCount == 0) || (maxBytes == 0)) {
    this_local = (XMLUTF8Transcoder *)0x0;
  }
  else {
    outEnd = toFill;
    srcEnd = srcData;
    while (srcEnd < srcData + srcCount) {
      encodedBytes = (uint)(ushort)*srcEnd;
      local_68 = 1;
      if ((0xd7ff < encodedBytes) && (encodedBytes < 0xdc00)) {
        if (srcData + srcCount <= srcEnd + 1) break;
        encodedBytes = (encodedBytes - 0xd800) * 0x400 + (ushort)srcEnd[1] + 0x2400;
        local_68 = 2;
      }
      if (encodedBytes < 0x80) {
        local_6c = 1;
LAB_002d5b26:
        if (toFill + maxBytes < outEnd + local_6c) break;
        srcEnd = srcEnd + local_68;
        pXVar2 = outEnd + local_6c;
        outEnd = pXVar2;
        switch(local_6c) {
        case 6:
          outEnd = pXVar2 + -1;
          pXVar2[-1] = (byte)encodedBytes & 0xbf | 0x80;
          encodedBytes = encodedBytes >> 6;
        case 5:
          outEnd[-1] = (byte)encodedBytes & 0xbf | 0x80;
          encodedBytes = encodedBytes >> 6;
          outEnd = outEnd + -1;
        case 4:
          outEnd[-1] = (byte)encodedBytes & 0xbf | 0x80;
          encodedBytes = encodedBytes >> 6;
          outEnd = outEnd + -1;
        case 3:
          outEnd[-1] = (byte)encodedBytes & 0xbf | 0x80;
          encodedBytes = encodedBytes >> 6;
          outEnd = outEnd + -1;
        case 2:
          outEnd[-1] = (byte)encodedBytes & 0xbf | 0x80;
          encodedBytes = encodedBytes >> 6;
          outEnd = outEnd + -1;
        case 1:
          outEnd[-1] = (byte)encodedBytes | *(byte *)((long)&gFirstByteMark + (ulong)local_6c);
          outEnd = outEnd + -1;
        default:
          outEnd = outEnd + local_6c;
        }
      }
      else {
        if (encodedBytes < 0x800) {
          local_6c = 2;
          goto LAB_002d5b26;
        }
        if (encodedBytes < 0x10000) {
          local_6c = 3;
          goto LAB_002d5b26;
        }
        if (encodedBytes < 0x110000) {
          local_6c = 4;
          goto LAB_002d5b26;
        }
        if (options == UnRep_Throw) {
          pMVar1 = XMLTranscoder::getMemoryManager(&this->super_XMLTranscoder);
          XMLString::binToText(encodedBytes,local_98,0x10,0x10,pMVar1);
          this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
          text2 = XMLTranscoder::getEncodingName(&this->super_XMLTranscoder);
          pMVar1 = XMLTranscoder::getMemoryManager(&this->super_XMLTranscoder);
          TranscodingException::TranscodingException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUTF8Transcoder.cpp"
                     ,0x1f0,Trans_Unrepresentable,local_98,text2,(XMLCh *)0x0,(XMLCh *)0x0,pMVar1);
          __cxa_throw(this_00,&TranscodingException::typeinfo,
                      TranscodingException::~TranscodingException);
        }
        *outEnd = ' ';
        srcEnd = srcEnd + local_68;
        outEnd = outEnd + 1;
      }
    }
    *charsEaten = (long)srcEnd - (long)srcData >> 1;
    this_local = (XMLUTF8Transcoder *)(outEnd + -(long)toFill);
  }
  return (XMLSize_t)this_local;
}

Assistant:

XMLSize_t
XMLUTF8Transcoder::transcodeTo( const   XMLCh* const    srcData
                                , const XMLSize_t       srcCount
                                ,       XMLByte* const  toFill
                                , const XMLSize_t       maxBytes
                                ,       XMLSize_t&      charsEaten
                                , const UnRepOpts       options)
{
    // Watch for pathological scenario. Shouldn't happen, but...
    if (!srcCount || !maxBytes)
        return 0;

    //
    //  Get pointers to our start and end points of the input and output
    //  buffers.
    //
    const XMLCh*    srcPtr = srcData;
    const XMLCh*    srcEnd = srcPtr + srcCount;
    XMLByte*        outPtr = toFill;
    XMLByte*        outEnd = toFill + maxBytes;

    while (srcPtr < srcEnd)
    {
        //
        //  Tentatively get the next char out. We have to get it into a
        //  32 bit value, because it could be a surrogate pair.
        //
        XMLUInt32 curVal = *srcPtr;

        //
        //  If its a leading surrogate, then lets see if we have the trailing
        //  available. If not, then give up now and leave it for next time.
        //
        unsigned int srcUsed = 1;
        if ((curVal >= 0xD800) && (curVal <= 0xDBFF))
        {
            if (srcPtr + 1 >= srcEnd)
                break;

            // Create the composite surrogate pair
            curVal = ((curVal - 0xD800) << 10)
                    + ((*(srcPtr + 1) - 0xDC00) + 0x10000);

            // And indicate that we ate another one
            srcUsed++;
        }

        // Figure out how many bytes we need
        unsigned int encodedBytes;
        if (curVal < 0x80)
            encodedBytes = 1;
        else if (curVal < 0x800)
            encodedBytes = 2;
        else if (curVal < 0x10000)
            encodedBytes = 3;
        else if (curVal < 0x110000)
            encodedBytes = 4;
        else
        {
            // If the options say to throw, then throw
            if (options == UnRep_Throw)
            {
                XMLCh tmpBuf[17];
                XMLString::binToText(curVal, tmpBuf, 16, 16, getMemoryManager());
                ThrowXMLwithMemMgr2
                (
                    TranscodingException
                    , XMLExcepts::Trans_Unrepresentable
                    , tmpBuf
                    , getEncodingName()
                    , getMemoryManager()
                );
            }

            // Else, use the replacement character
            *outPtr++ = chSpace;
            srcPtr += srcUsed;
            continue;
        }

        //
        //  If we cannot fully get this char into the output buffer,
        //  then leave it for the next time.
        //
        if (outPtr + encodedBytes > outEnd)
            break;

        // We can do it, so update the source index
        srcPtr += srcUsed;

        //
        //  And spit out the bytes. We spit them out in reverse order
        //  here, so bump up the output pointer and work down as we go.
        //
        outPtr += encodedBytes;
        switch(encodedBytes)
        {
            case 6 : *--outPtr = XMLByte((curVal | 0x80UL) & 0xBFUL);
                     curVal >>= 6;
            case 5 : *--outPtr = XMLByte((curVal | 0x80UL) & 0xBFUL);
                     curVal >>= 6;
            case 4 : *--outPtr = XMLByte((curVal | 0x80UL) & 0xBFUL);
                     curVal >>= 6;
            case 3 : *--outPtr = XMLByte((curVal | 0x80UL) & 0xBFUL);
                     curVal >>= 6;
            case 2 : *--outPtr = XMLByte((curVal | 0x80UL) & 0xBFUL);
                     curVal >>= 6;
            case 1 : *--outPtr = XMLByte
                     (
                        curVal | gFirstByteMark[encodedBytes]
                     );
        }

        // Add the encoded bytes back in again to indicate we've eaten them
        outPtr += encodedBytes;
    }

    // Fill in the chars we ate
    charsEaten = (srcPtr - srcData);

    // And return the bytes we filled in
    return (outPtr - toFill);
}